

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O0

void undo_moves(node *newest_node,Pyraminx *pyraminx)

{
  undefined4 corner;
  undefined4 layer;
  bool bVar1;
  reference pmVar2;
  Corner local_5c;
  int iStack_58;
  move_type move;
  iterator __end1;
  iterator __begin1;
  vector<move_type,_std::allocator<move_type>_> *__range1;
  vector<move_type,_std::allocator<move_type>_> move_list;
  Direction undo_dir;
  Pyraminx *pyraminx_local;
  node *newest_node_local;
  
  get_move_list((vector<move_type,_std::allocator<move_type>_> *)&__range1,newest_node);
  __end1 = std::vector<move_type,_std::allocator<move_type>_>::begin
                     ((vector<move_type,_std::allocator<move_type>_> *)&__range1);
  move._4_8_ = std::vector<move_type,_std::allocator<move_type>_>::end
                         ((vector<move_type,_std::allocator<move_type>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>
                                     *)&move.layer), bVar1) {
    pmVar2 = __gnu_cxx::
             __normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>::
             operator*(&__end1);
    corner = pmVar2->ref_corner;
    layer = pmVar2->layer;
    move.ref_corner = pmVar2->dir;
    move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = move.ref_corner == clockwise;
    Pyraminx::turn_layer
              (pyraminx,corner,layer,
               move_list.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    __gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>::
    operator++(&__end1);
  }
  std::vector<move_type,_std::allocator<move_type>_>::~vector
            ((vector<move_type,_std::allocator<move_type>_> *)&__range1);
  return;
}

Assistant:

void undo_moves(const node* newest_node, Pyraminx& pyraminx){
    Direction undo_dir;
    std::vector<move_type> move_list = get_move_list(newest_node);
    for(move_type move : move_list){
        if (move.dir == Direction::clockwise){
            undo_dir = Direction::counterclockwise;
        }
        else{
            undo_dir = Direction::clockwise;
        }
        pyraminx.turn_layer(move.ref_corner, move.layer, undo_dir);
    }
}